

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O1

void __thiscall RBTS<TTA>::PerformLabeling(RBTS<TTA> *this)

{
  int iVar1;
  int *piVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  bool bVar5;
  uint uVar6;
  uint *puVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  void *pvVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  uint *img_labels_row;
  uint *img_labels_row_prev;
  ulong local_e8;
  ulong local_e0;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar2 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar2,piVar2[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar19 = *(int *)&pMVar3->field_0xc;
  TTA::Alloc(((iVar19 - (iVar19 + 1 >> 0x1f)) + 1 >> 1) * ((iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1) +
             1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0xc;
  uVar10 = *(uint *)&pMVar3->field_0x8;
  uVar18 = 0xffffffffffffffff;
  if (-6 < (long)iVar1) {
    uVar18 = (long)(iVar1 / 2) * 4 + 8;
  }
  pvVar11 = operator_new__(uVar18);
  pvVar12 = operator_new__(uVar18);
  if (0 < (int)uVar10) {
    uVar30 = (long)(iVar1 / 2) + 2;
    uVar22 = 0;
    local_e8 = 0;
    uVar17 = 0;
    local_e0 = 0;
    uVar18 = 0;
    do {
      if (0 < iVar1) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        lVar16 = **(long **)&pMVar3->field_0x48 * uVar22 + *(long *)&pMVar3->field_0x10;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar24 = **(long **)&pMVar4->field_0x48;
        lVar23 = lVar24 * uVar22 + *(long *)&pMVar4->field_0x10;
        lVar24 = lVar23 - lVar24;
        iVar19 = (int)uVar22 * iVar1;
        iVar26 = 0;
        do {
          lVar27 = (long)iVar26;
          iVar28 = iVar26;
          if (*(char *)(lVar16 + lVar27) != '\0') {
            iVar14 = iVar26 + iVar19;
            *(int *)((long)pvVar11 + local_e8 * 4) = iVar14;
            local_e8 = (local_e8 + 1) % uVar30;
            iVar25 = iVar26 + 1;
            if (iVar26 + 1 < iVar1) {
              iVar25 = iVar1;
            }
            do {
              lVar27 = lVar27 + 1;
              iVar9 = iVar25;
              if (iVar1 <= lVar27) break;
              iVar9 = iVar28 + 1;
              iVar28 = iVar9;
            } while (*(char *)(lVar16 + lVar27) != '\0');
            iVar28 = iVar9 + -1;
            iVar29 = iVar28 + iVar19;
            *(int *)((long)pvVar12 + local_e0 * 4) = iVar29;
            local_e0 = (local_e0 + 1) % uVar30;
            iVar25 = *(int *)((long)pvVar12 + uVar17 * 4);
            while (iVar25 < (int)((iVar14 - iVar1) - (uint)(iVar26 != 0))) {
              uVar18 = (uVar18 + 1) % uVar30;
              uVar17 = (uVar17 + 1) % uVar30;
              iVar25 = *(int *)((long)pvVar12 + uVar17 * 4);
            }
            iVar20 = *(int *)((long)pvVar11 + uVar18 * 4);
            iVar29 = iVar29 - iVar1;
            iVar9 = (uint)(iVar9 != iVar1) + iVar29;
            if (iVar9 < iVar20) {
              TTA::rtable_[TTA::length_] = TTA::length_;
              TTA::next_[TTA::length_] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar6 = TTA::length_;
              TTA::length_ = TTA::length_ + 1;
              uVar21 = (uint)((long)iVar14 % (long)iVar1);
              uVar15 = (iVar28 - iVar26) + uVar21 + 1;
              if (uVar21 < uVar15) {
                uVar13 = (long)iVar14 % (long)iVar1 & 0xffffffff;
                do {
                  *(uint *)(lVar23 + uVar13 * 4) = uVar6;
                  uVar13 = uVar13 + 1;
                } while (uVar15 != uVar13);
              }
            }
            else {
              uVar21 = *(uint *)(lVar24 + (long)(iVar20 % iVar1) * 4);
              uVar13 = (long)iVar14 % (long)iVar1 & 0xffffffff;
              uVar6 = (uint)((long)iVar14 % (long)iVar1);
              uVar15 = (iVar28 - iVar26) + uVar6 + 1;
              if (uVar6 < uVar15) {
                do {
                  *(uint *)(lVar23 + uVar13 * 4) = uVar21;
                  uVar13 = uVar13 + 1;
                } while (uVar15 != uVar13);
              }
              bVar5 = iVar25 <= iVar29;
              if (iVar25 <= iVar29) {
                bVar8 = false;
                do {
                  if (bVar8) {
                    TTA::Merge(*(uint *)(lVar24 + (long)(iVar20 % iVar1) * 4),uVar21);
                  }
                  uVar18 = (uVar18 + 1) % uVar30;
                  iVar20 = *(int *)((long)pvVar11 + uVar18 * 4);
                  uVar17 = (uVar17 + 1) % uVar30;
                  iVar25 = *(int *)((long)pvVar12 + uVar17 * 4);
                  bVar8 = true;
                } while (iVar25 <= iVar29);
              }
              if (iVar25 <= iVar29) {
                do {
                  uVar18 = (uVar18 + 1) % uVar30;
                  uVar17 = (uVar17 + 1) % uVar30;
                } while (*(int *)((long)pvVar12 + uVar17 * 4) <= iVar29);
                iVar20 = *(int *)((long)pvVar11 + uVar18 * 4);
                bVar5 = true;
              }
              if ((iVar20 <= iVar9) && (bVar5)) {
                TTA::Merge(*(uint *)(lVar23 + (long)(int)uVar6 * 4),
                           *(uint *)(lVar24 + (long)(iVar20 % iVar1) * 4));
              }
            }
          }
          iVar26 = iVar28 + 1;
        } while (iVar26 < iVar1);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar10);
  }
  puVar7 = TTA::rtable_;
  uVar10 = 1;
  if (1 < TTA::length_) {
    uVar10 = 1;
    uVar18 = 1;
    do {
      if (uVar18 == puVar7[uVar18]) {
        uVar10 = uVar10 + 1;
        uVar21 = uVar10;
      }
      else {
        uVar21 = puVar7[puVar7[uVar18]];
      }
      puVar7[uVar18] = uVar21;
      uVar18 = uVar18 + 1;
    } while (uVar18 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  puVar7 = TTA::rtable_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar4->field_0x8) {
    lVar24 = *(long *)&pMVar4->field_0x10;
    lVar16 = **(long **)&pMVar4->field_0x48;
    lVar23 = 0;
    do {
      iVar1 = *(int *)&pMVar4->field_0xc;
      if ((long)iVar1 != 0) {
        lVar27 = 0;
        do {
          *(uint *)(lVar24 + lVar27) = puVar7[*(uint *)(lVar24 + lVar27)];
          lVar27 = lVar27 + 4;
        } while ((long)iVar1 * 4 != lVar27);
      }
      lVar23 = lVar23 + 1;
      lVar24 = lVar24 + lVar16;
    } while (lVar23 < *(int *)&pMVar4->field_0x8);
  }
  TTA::Dealloc();
  operator_delete__(pvVar12);
  operator_delete__(pvVar11);
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        // Circular Buffers
        int buffer_capacity = w / 2 + 2;
        CircularBuffer<int> s_queue(buffer_capacity);
        CircularBuffer<int> e_queue(buffer_capacity);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue.Front();
                int t = e_queue.Front();
                while (t < s - w - clb) {
                    h = s_queue.DequeueAndFront();
                    t = e_queue.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue.DequeueAndFront();
                        t = e_queue.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue.Dequeue();
                        e_queue.Dequeue();
                        h = s_queue.Front();
                        t = e_queue.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int* img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int* img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int* img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }